

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O0

void lrit::to_json(json *j,ImageNavigationHeader *h)

{
  long in_RSI;
  size_type rpos;
  string projectionName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb38;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffb40;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffb48;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffb50;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  in_stack_fffffffffffffb58;
  value_t in_stack_fffffffffffffbce;
  undefined1 in_stack_fffffffffffffbcf;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffbd0;
  initializer_list_t in_stack_fffffffffffffbd8;
  undefined1 **local_3c0;
  undefined1 **local_3a8;
  undefined1 **local_390;
  undefined1 **local_378;
  undefined1 **local_360;
  undefined1 **local_348;
  undefined1 *local_300 [8];
  undefined8 *local_2c0;
  undefined8 local_2b8;
  undefined4 local_2ac;
  undefined8 *local_2a8;
  undefined1 *local_2a0 [4];
  undefined1 local_280 [32];
  undefined8 *local_260;
  undefined8 local_258;
  undefined4 local_24c;
  undefined8 *local_248;
  undefined1 *local_240 [4];
  undefined1 local_220 [32];
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined4 local_1ec;
  undefined8 *local_1e8;
  undefined1 *local_1e0 [4];
  undefined1 local_1c0 [32];
  undefined8 *local_1a0;
  undefined8 local_198;
  undefined1 local_189;
  string local_188 [48];
  undefined8 *local_158;
  undefined1 *local_150 [4];
  undefined1 local_130 [32];
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 *local_100;
  undefined1 *local_f8 [4];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 local_38;
  string local_30 [32];
  long local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30,(string *)(in_RSI + 8));
  local_38 = std::__cxx11::string::find((char)local_30,0x29);
  local_100 = local_f8;
  local_189 = 1;
  local_158 = local_150;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[15]>(in_stack_fffffffffffffb40,(char (*) [15])in_stack_fffffffffffffb38);
  local_158 = (undefined8 *)local_130;
  std::__cxx11::string::substr((ulong)local_188,(ulong)local_30);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<std::__cxx11::string>(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  local_189 = 0;
  local_110 = local_150;
  local_108 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffb50,in_stack_fffffffffffffb58);
  local_100 = (undefined8 *)local_d8;
  local_1e8 = local_1e0;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[14]>(in_stack_fffffffffffffb40,(char (*) [14])in_stack_fffffffffffffb38);
  local_1e8 = (undefined8 *)local_1c0;
  local_1ec = *(undefined4 *)(local_10 + 0x28);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref<int>(in_stack_fffffffffffffb40,(int *)in_stack_fffffffffffffb38);
  local_1a0 = local_1e0;
  local_198 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffb50,in_stack_fffffffffffffb58);
  local_100 = (undefined8 *)local_b8;
  local_248 = local_240;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[12]>(in_stack_fffffffffffffb40,(char (*) [12])in_stack_fffffffffffffb38);
  local_248 = (undefined8 *)local_220;
  local_24c = *(undefined4 *)(local_10 + 0x2c);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref<int>(in_stack_fffffffffffffb40,(int *)in_stack_fffffffffffffb38);
  local_200 = local_240;
  local_1f8 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffb50,in_stack_fffffffffffffb58);
  local_100 = (undefined8 *)local_98;
  local_2a8 = local_2a0;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[13]>(in_stack_fffffffffffffb40,(char (*) [13])in_stack_fffffffffffffb38);
  local_2a8 = (undefined8 *)local_280;
  local_2ac = *(undefined4 *)(local_10 + 0x30);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref<int>(in_stack_fffffffffffffb40,(int *)in_stack_fffffffffffffb38);
  local_260 = local_2a0;
  local_258 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffb50,in_stack_fffffffffffffb58);
  local_100 = (undefined8 *)local_78;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[11]>(in_stack_fffffffffffffb40,(char (*) [11])in_stack_fffffffffffffb38);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref<int>(in_stack_fffffffffffffb40,(int *)in_stack_fffffffffffffb38);
  local_2c0 = local_300;
  local_2b8 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffb50,in_stack_fffffffffffffb58);
  local_58 = local_f8;
  local_50 = 5;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbd8,(bool)in_stack_fffffffffffffbcf,
               in_stack_fffffffffffffbce);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=(&in_stack_fffffffffffffb50->owned_value,in_stack_fffffffffffffb48);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&in_stack_fffffffffffffb40->owned_value);
  local_348 = (undefined1 **)&local_58;
  do {
    local_348 = local_348 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17d86b);
  } while (local_348 != local_f8);
  local_360 = (undefined1 **)&local_2c0;
  do {
    local_360 = local_360 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17d8bd);
  } while (local_360 != local_300);
  local_378 = (undefined1 **)&local_260;
  do {
    local_378 = local_378 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17d90f);
  } while (local_378 != local_2a0);
  local_390 = (undefined1 **)&local_200;
  do {
    local_390 = local_390 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17d961);
  } while (local_390 != local_240);
  local_3a8 = (undefined1 **)&local_1a0;
  do {
    local_3a8 = local_3a8 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17d9b3);
  } while (local_3a8 != local_1e0);
  local_3c0 = (undefined1 **)&local_110;
  do {
    local_3c0 = local_3c0 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17da05);
  } while (local_3c0 != local_150);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void to_json(json& j, const ImageNavigationHeader& h) {
  std::string projectionName(h.projectionName);
  auto rpos = projectionName.find(')');
  j = {
      {"ProjectionName", projectionName.substr(0, rpos + 1)},
      {"ColumnScaling", int(h.columnScaling)},
      {"LineScaling", int(h.lineScaling)},
      {"ColumnOffset", int(h.columnOffset)},
      {"LineOffset", int(h.lineOffset)},
  };
}